

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall mjs::print_visitor::operator()(print_visitor *this,switch_statement *s)

{
  pointer pcVar1;
  pointer puVar2;
  case_clause *c;
  pointer pcVar3;
  unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *cs;
  pointer puVar4;
  
  std::operator<<(this->os_,"switch (");
  accept<mjs::print_visitor>
            ((s->e_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
  std::operator<<(this->os_,") {");
  pcVar1 = (s->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar3 = (s->cl_).super__Vector_base<mjs::case_clause,_std::allocator<mjs::case_clause>_>.
                _M_impl.super__Vector_impl_data._M_start; pcVar3 != pcVar1; pcVar3 = pcVar3 + 1) {
    std::operator<<(this->os_," ");
    if ((pcVar3->e_)._M_t.
        super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
        super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
        super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl == (expression *)0x0) {
      std::operator<<(this->os_,"default");
    }
    else {
      std::operator<<(this->os_,"case ");
      accept<mjs::print_visitor>
                ((pcVar3->e_)._M_t.
                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                 super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
    }
    std::operator<<(this->os_,": ");
    puVar2 = (pcVar3->sl_).
             super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (pcVar3->sl_).
                  super__Vector_base<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_std::allocator<std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1)
    {
      accept<mjs::print_visitor>
                ((puVar4->_M_t).
                 super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
                 super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,this);
    }
  }
  std::operator<<(this->os_,"}");
  return;
}

Assistant:

void operator()(const switch_statement& s) {
        os_ << "switch (";
        accept(s.e(), *this);
        os_ << ") {";
        for (const auto& c: s.cl()) {
            os_ << " ";
            if (const auto& e = c.e()) {
                os_ << "case ";
                accept(*e, *this);
            } else {
                os_ << "default";
            }
            os_ << ": ";
            for (const auto& cs: c.sl()) {
                accept(*cs, *this);
            }
        }
        os_ << "}";
    }